

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O1

bool intersects(Bounds *x,Bounds *y,int dim,bool wrap,Bounds *domain)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,wrap) != 0) {
    fVar2 = (x->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    fVar3 = (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
      fVar2 = (y->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
      pfVar1 = (domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin +
               dim;
      if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
        return true;
      }
    }
    fVar2 = (y->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
      fVar2 = (x->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
      pfVar1 = (domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin +
               dim;
      if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
        return true;
      }
    }
  }
  if ((x->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim] <=
      (y->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim]) {
    return (y->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim] <=
           (x->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
  }
  return false;
}

Assistant:

bool intersects(const Bounds& x, const Bounds& y, int dim, bool wrap, const Bounds& domain)
{
    if (wrap)
    {
        if (x.min[dim] == domain.min[dim] && y.max[dim] == domain.max[dim])
            return true;
        if (y.min[dim] == domain.min[dim] && x.max[dim] == domain.max[dim])
            return true;
    }
    return x.min[dim] <= y.max[dim] && y.min[dim] <= x.max[dim];
}